

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

char * glfwGetJoystickGUID(int jid)

{
  int iVar1;
  char *pcVar2;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pranjalpokharel7[P]our-rocket/GLFW/src/input.c"
                  ,0x41f,"const char *glfwGetJoystickGUID(int)");
  }
  if (0xf < (uint)jid) {
    __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pranjalpokharel7[P]our-rocket/GLFW/src/input.c"
                  ,0x420,"const char *glfwGetJoystickGUID(int)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    pcVar2 = (char *)0x0;
  }
  else if (_glfw.joysticks[(uint)jid].present == 0) {
    pcVar2 = (char *)0x0;
  }
  else {
    iVar1 = _glfwPlatformPollJoystick(_glfw.joysticks + (uint)jid,0);
    pcVar2 = (char *)0x0;
    if (iVar1 != 0) {
      pcVar2 = _glfw.joysticks[(uint)jid].guid;
    }
  }
  return pcVar2;
}

Assistant:

GLFWAPI const char* glfwGetJoystickGUID(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    js = _glfw.joysticks + jid;
    if (!js->present)
        return NULL;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_PRESENCE))
        return NULL;

    return js->guid;
}